

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int mbedtls_base64_decode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  byte c;
  bool bVar1;
  char cVar2;
  uchar c_00;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  uchar *puVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar9 = 0;
  uVar11 = 0;
  for (uVar3 = 0; uVar8 = (uint)uVar11, uVar4 = uVar3, uVar3 < slen; uVar3 = uVar3 + 1) {
    bVar1 = false;
    while( true ) {
      uVar4 = slen;
      if (slen == uVar3) goto LAB_001f3b20;
      if (src[uVar3] != ' ') break;
      uVar3 = uVar3 + 1;
      bVar1 = true;
    }
    if (slen == uVar3) break;
    c_00 = src[uVar3];
    if (c_00 == '\r' && 1 < slen - uVar3) {
      if (src[uVar3 + 1] != '\n') {
        c_00 = '\r';
        if (bVar1) {
          return -0x2c;
        }
LAB_001f3af0:
        if (uVar8 != 0) {
          return -0x2c;
        }
        cVar2 = mbedtls_ct_base64_dec_value(c_00);
        uVar11 = 0;
        if (cVar2 < '\0') {
          return -0x2c;
        }
LAB_001f3b12:
        uVar9 = uVar9 + 1;
      }
    }
    else if (c_00 != '\n') {
      if (bVar1 || (char)c_00 < '\0') {
        return -0x2c;
      }
      if (c_00 != '=') goto LAB_001f3af0;
      if (1 < uVar8) {
        return -0x2c;
      }
      uVar11 = (ulong)(uVar8 + 1);
      goto LAB_001f3b12;
    }
  }
LAB_001f3b20:
  if (uVar9 == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = ((uVar9 >> 3) * 6 - uVar11) + (ulong)(((uint)uVar9 & 7) * 6 + 7 >> 3);
    iVar7 = -0x2a;
    if ((dst == (uchar *)0x0) || (dlen < sVar5)) goto LAB_001f3c1c;
    uVar10 = 0;
    iVar7 = 0;
    uVar8 = 0;
    puVar6 = dst;
    for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
      c = src[uVar11];
      if ((0x20 < (ulong)c) || ((0x100002400U >> ((ulong)c & 0x3f) & 1) == 0)) {
        uVar10 = uVar10 << 6;
        if (c == 0x3d) {
          uVar8 = uVar8 + 1;
        }
        else {
          cVar2 = mbedtls_ct_base64_dec_value(c);
          uVar10 = uVar10 | (int)cVar2;
        }
        iVar7 = iVar7 + 1;
        if (iVar7 == 4) {
          *puVar6 = (uchar)(uVar10 >> 0x10);
          iVar7 = 0;
          if (uVar8 < 2) {
            puVar6[1] = (uchar)(uVar10 >> 8);
            if (uVar8 == 0) {
              puVar6[2] = (uchar)uVar10;
              puVar6 = puVar6 + 3;
              iVar7 = 0;
              uVar8 = 0;
            }
            else {
              puVar6 = puVar6 + 2;
              uVar8 = 1;
              iVar7 = 0;
            }
          }
          else {
            puVar6 = puVar6 + 1;
          }
        }
      }
    }
    sVar5 = (long)puVar6 - (long)dst;
  }
  iVar7 = 0;
LAB_001f3c1c:
  *olen = sVar5;
  return iVar7;
}

Assistant:

int mbedtls_base64_decode(unsigned char *dst, size_t dlen, size_t *olen,
                          const unsigned char *src, size_t slen)
{
    size_t i; /* index in source */
    size_t n; /* number of digits or trailing = in source */
    uint32_t x; /* value accumulator */
    unsigned accumulated_digits = 0;
    unsigned equals = 0;
    int spaces_present = 0;
    unsigned char *p;

    /* First pass: check for validity and get output length */
    for (i = n = 0; i < slen; i++) {
        /* Skip spaces before checking for EOL */
        spaces_present = 0;
        while (i < slen && src[i] == ' ') {
            ++i;
            spaces_present = 1;
        }

        /* Spaces at end of buffer are OK */
        if (i == slen) {
            break;
        }

        if ((slen - i) >= 2 &&
            src[i] == '\r' && src[i + 1] == '\n') {
            continue;
        }

        if (src[i] == '\n') {
            continue;
        }

        /* Space inside a line is an error */
        if (spaces_present) {
            return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
        }

        if (src[i] > 127) {
            return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
        }

        if (src[i] == '=') {
            if (++equals > 2) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
        } else {
            if (equals != 0) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
            if (mbedtls_ct_base64_dec_value(src[i]) < 0) {
                return MBEDTLS_ERR_BASE64_INVALID_CHARACTER;
            }
        }
        n++;
    }

    if (n == 0) {
        *olen = 0;
        return 0;
    }

    /* The following expression is to calculate the following formula without
     * risk of integer overflow in n:
     *     n = ( ( n * 6 ) + 7 ) >> 3;
     */
    n = (6 * (n >> 3)) + ((6 * (n & 0x7) + 7) >> 3);
    n -= equals;

    if (dst == NULL || dlen < n) {
        *olen = n;
        return MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL;
    }

    equals = 0;
    for (x = 0, p = dst; i > 0; i--, src++) {
        if (*src == '\r' || *src == '\n' || *src == ' ') {
            continue;
        }

        x = x << 6;
        if (*src == '=') {
            ++equals;
        } else {
            x |= mbedtls_ct_base64_dec_value(*src);
        }

        if (++accumulated_digits == 4) {
            accumulated_digits = 0;
            *p++ = MBEDTLS_BYTE_2(x);
            if (equals <= 1) {
                *p++ = MBEDTLS_BYTE_1(x);
            }
            if (equals <= 0) {
                *p++ = MBEDTLS_BYTE_0(x);
            }
        }
    }

    *olen = p - dst;

    return 0;
}